

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O0

void __thiscall CProjectile::Tick(CProjectile *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  IServer *pIVar4;
  CGameContext *this_00;
  CCharacter *pCVar5;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  float Owner;
  float v;
  float Weapon;
  vec2 vVar7;
  vec2 Pos;
  vec2 in_stack_00000020;
  vec2 in_stack_00000028;
  CCharacter *TargetChr;
  CCharacter *OwnerChar;
  int Collide;
  float Ct;
  float Pt;
  vec2 CurPos;
  vec2 PrevPos;
  CEntity *in_stack_ffffffffffffff58;
  CCharacter *in_stack_ffffffffffffff60;
  CGameContext *in_stack_ffffffffffffff78;
  vec2 in_stack_ffffffffffffff80;
  vec2 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  CGameContext *this_01;
  vec2 in_stack_ffffffffffffffb0;
  vec2 in_stack_ffffffffffffffb8;
  vec2 in_stack_ffffffffffffffc0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 Weapon_00;
  vec2 Pos0;
  float Radius;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pIVar4 = CEntity::Server((CEntity *)0x11dfd0);
  iVar3 = IServer::Tick(pIVar4);
  fVar6 = (float)(~(in_RDI->m_Collision).m_Width + iVar3);
  pIVar4 = CEntity::Server((CEntity *)0x11dff5);
  iVar3 = IServer::TickSpeed(pIVar4);
  Owner = fVar6 / (float)iVar3;
  pIVar4 = CEntity::Server((CEntity *)0x11e01b);
  iVar3 = IServer::Tick(pIVar4);
  v = (float)(iVar3 - (in_RDI->m_Collision).m_Width);
  pIVar4 = CEntity::Server((CEntity *)0x11e03c);
  iVar3 = IServer::TickSpeed(pIVar4);
  Weapon = v / (float)iVar3;
  vVar7 = GetPos((CProjectile *)in_stack_ffffffffffffff80,
                 (float)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  Pos = GetPos((CProjectile *)in_stack_ffffffffffffff80,
               (float)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  this_00 = CEntity::GameServer((CEntity *)0x11e094);
  CGameContext::Collision(this_00);
  Pos0 = Pos;
  iVar3 = CCollision::IntersectLine
                    ((CCollision *)in_stack_ffffffffffffff80,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0,(vec2 *)in_stack_ffffffffffffff78,(vec2 *)in_RDI);
  CEntity::GameServer((CEntity *)0x11e0f0);
  pCVar5 = CGameContext::GetPlayerChar
                     ((CGameContext *)CONCAT44(v,fVar6),
                      (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  Radius = (float)((ulong)pCVar5 >> 0x20);
  CEntity::GameWorld((CEntity *)in_RDI);
  pCVar5 = CGameWorld::IntersectCharacter
                     ((CGameWorld *)CONCAT44(iVar3,in_stack_ffffffffffffff98),Pos0,
                      in_stack_ffffffffffffffc0,Radius,in_stack_ffffffffffffff88,
                      (CEntity *)in_stack_ffffffffffffff80);
  *(int *)&(in_RDI->m_Layers).m_pGameGroup = *(int *)&(in_RDI->m_Layers).m_pGameGroup + -1;
  if ((((pCVar5 != (CCharacter *)0x0) || (iVar3 != 0)) ||
      (*(int *)&(in_RDI->m_Layers).m_pGameGroup < 0)) ||
     (bVar2 = CEntity::GameLayerClipped
                        ((CEntity *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80), bVar2)) {
    if ((-1 < *(int *)&(in_RDI->m_Layers).m_pGameGroup) ||
       (*(int *)&(in_RDI->m_Collision).m_pTiles == 3)) {
      CEntity::GameServer((CEntity *)0x11e1c8);
      CGameContext::CreateSound
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20),
                 CONCAT44(v,fVar6));
    }
    if (((in_RDI->m_Collision).m_Height & 1) == 0) {
      if (pCVar5 != (CCharacter *)0x0) {
        in_stack_ffffffffffffff58 = (CEntity *)&(in_RDI->m_Layers).m_LayersNum;
        maximum<float>(0.001,*(float *)((long)&(in_RDI->m_Collision).m_pTiles + 4));
        Weapon_00 = Pos.field_1;
        vector2_base<float>::operator*((vector2_base<float> *)in_RDI,v);
        vector2_base<float>::operator*((vector2_base<float> *)in_RDI,v);
        CCharacter::TakeDamage
                  ((CCharacter *)Pos0,in_stack_00000028,in_stack_00000020,(int)vVar7.field_1,
                   (int)vVar7.field_0,(int)Weapon_00);
        in_stack_ffffffffffffff60 = pCVar5;
      }
    }
    else {
      CEntity::GameServer((CEntity *)0x11e207);
      CGameContext::CreateExplosion(this_01,Pos,(int)Owner,(int)Weapon,iVar3);
    }
    CEntity::GameWorld((CEntity *)in_RDI);
    CGameWorld::DestroyEntity((CGameWorld *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CProjectile::Tick()
{
	float Pt = (Server()->Tick()-m_StartTick-1)/(float)Server()->TickSpeed();
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();
	vec2 PrevPos = GetPos(Pt);
	vec2 CurPos = GetPos(Ct);
	int Collide = GameServer()->Collision()->IntersectLine(PrevPos, CurPos, &CurPos, 0);
	CCharacter *OwnerChar = GameServer()->GetPlayerChar(m_Owner);
	CCharacter *TargetChr = GameWorld()->IntersectCharacter(PrevPos, CurPos, 6.0f, CurPos, OwnerChar);

	m_LifeSpan--;

	if(TargetChr || Collide || m_LifeSpan < 0 || GameLayerClipped(CurPos))
	{
		if(m_LifeSpan >= 0 || m_Weapon == WEAPON_GRENADE)
			GameServer()->CreateSound(CurPos, m_SoundImpact);

		if(m_Explosive)
			GameServer()->CreateExplosion(CurPos, m_Owner, m_Weapon, m_Damage);

		else if(TargetChr)
			TargetChr->TakeDamage(m_Direction * maximum(0.001f, m_Force), m_Direction*-1, m_Damage, m_Owner, m_Weapon);

		GameWorld()->DestroyEntity(this);
	}
}